

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O2

void test_mp_get_nbits(void)

{
  mp_int *x;
  mp_int *x_00;
  size_t sVar1;
  mp_int *a;
  size_t *psVar2;
  size_t i;
  ulong uVar3;
  
  x = mp_new(0x200);
  uVar3 = 0;
  x_00 = mp_from_integer(0);
  psVar2 = test_mp_get_nbits::bitposns;
  while( true ) {
    sVar1 = (*looplimit)(10);
    if (sVar1 <= uVar3) break;
    a = mp_power_2(*psVar2);
    mp_add_into(x,a,x_00);
    mp_free(x_00);
    log_start();
    mp_get_nbits(x);
    log_end();
    uVar3 = uVar3 + 1;
    psVar2 = psVar2 + 1;
    x_00 = a;
  }
  mp_free(x_00);
  mp_free(x);
  return;
}

Assistant:

static void test_mp_get_nbits(void)
{
    mp_int *z = mp_new(512);
    static const size_t bitposns[] = {
        0, 1, 5, 16, 23, 32, 67, 123, 234, 511
    };
    mp_int *prev = mp_from_integer(0);
    for (size_t i = 0; i < looplimit(lenof(bitposns)); i++) {
        mp_int *x = mp_power_2(bitposns[i]);
        mp_add_into(z, x, prev);
        mp_free(prev);
        prev = x;
        log_start();
        mp_get_nbits(z);
        log_end();
    }
    mp_free(prev);
    mp_free(z);
}